

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

_Bool ts_parser__replace_children(TSParser *self,MutableSubtree *tree,SubtreeArray *children)

{
  SubtreeHeapData *pSVar1;
  SubtreeHeapData *pSVar2;
  undefined8 uVar3;
  TSPoint TVar4;
  undefined8 uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  TSSymbol TVar8;
  TSStateId TVar9;
  undefined4 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  _Bool _Var15;
  Subtree left;
  Subtree right;
  SubtreeArray *children_local;
  MutableSubtree *tree_local;
  TSParser *self_local;
  
  pSVar1 = (self->scratch_tree).ptr;
  pSVar2 = tree->ptr;
  *(undefined8 *)((long)&pSVar1->field_17 + 0x20) = *(undefined8 *)((long)&pSVar2->field_17 + 0x20);
  uVar3 = *(undefined8 *)((long)&pSVar2->field_17 + 0x18);
  *(undefined8 *)((long)&pSVar1->field_17 + 0x10) = *(undefined8 *)((long)&pSVar2->field_17 + 0x10);
  *(undefined8 *)((long)&pSVar1->field_17 + 0x18) = uVar3;
  uVar13 = pSVar2->ref_count;
  uVar14 = (pSVar2->padding).bytes;
  TVar4 = (pSVar2->padding).extent;
  uVar11 = (pSVar2->size).bytes;
  uVar12 = (pSVar2->size).extent.row;
  uVar3 = *(undefined8 *)&(pSVar2->size).extent.column;
  uVar6 = pSVar2->error_cost;
  uVar7 = pSVar2->child_count;
  TVar8 = pSVar2->symbol;
  TVar9 = pSVar2->parse_state;
  uVar10 = *(undefined4 *)&pSVar2->field_0x2c;
  uVar5 = *(undefined8 *)((long)&pSVar2->field_17 + 8);
  (pSVar1->field_17).field_0.children = (pSVar2->field_17).field_0.children;
  *(undefined8 *)((long)&pSVar1->field_17 + 8) = uVar5;
  pSVar1->error_cost = uVar6;
  pSVar1->child_count = uVar7;
  pSVar1->symbol = TVar8;
  pSVar1->parse_state = TVar9;
  *(undefined4 *)&pSVar1->field_0x2c = uVar10;
  (pSVar1->size).bytes = uVar11;
  (pSVar1->size).extent.row = uVar12;
  *(undefined8 *)&(pSVar1->size).extent.column = uVar3;
  pSVar1->ref_count = uVar13;
  (pSVar1->padding).bytes = uVar14;
  (pSVar1->padding).extent = TVar4;
  ((self->scratch_tree).ptr)->child_count = 0;
  ts_subtree_set_children(self->scratch_tree,children->contents,children->size,self->language);
  left = ts_subtree_from_mut(*tree);
  right = ts_subtree_from_mut(self->scratch_tree);
  _Var15 = ts_parser__select_tree(self,left,right);
  if (_Var15) {
    pSVar1 = tree->ptr;
    pSVar2 = (self->scratch_tree).ptr;
    *(undefined8 *)((long)&pSVar1->field_17 + 0x20) =
         *(undefined8 *)((long)&pSVar2->field_17 + 0x20);
    uVar3 = *(undefined8 *)((long)&pSVar2->field_17 + 0x18);
    *(undefined8 *)((long)&pSVar1->field_17 + 0x10) =
         *(undefined8 *)((long)&pSVar2->field_17 + 0x10);
    *(undefined8 *)((long)&pSVar1->field_17 + 0x18) = uVar3;
    uVar13 = pSVar2->ref_count;
    uVar14 = (pSVar2->padding).bytes;
    TVar4 = (pSVar2->padding).extent;
    uVar11 = (pSVar2->size).bytes;
    uVar12 = (pSVar2->size).extent.row;
    uVar3 = *(undefined8 *)&(pSVar2->size).extent.column;
    uVar6 = pSVar2->error_cost;
    uVar7 = pSVar2->child_count;
    TVar8 = pSVar2->symbol;
    TVar9 = pSVar2->parse_state;
    uVar10 = *(undefined4 *)&pSVar2->field_0x2c;
    uVar5 = *(undefined8 *)((long)&pSVar2->field_17 + 8);
    (pSVar1->field_17).field_0.children = (pSVar2->field_17).field_0.children;
    *(undefined8 *)((long)&pSVar1->field_17 + 8) = uVar5;
    pSVar1->error_cost = uVar6;
    pSVar1->child_count = uVar7;
    pSVar1->symbol = TVar8;
    pSVar1->parse_state = TVar9;
    *(undefined4 *)&pSVar1->field_0x2c = uVar10;
    (pSVar1->size).bytes = uVar11;
    (pSVar1->size).extent.row = uVar12;
    *(undefined8 *)&(pSVar1->size).extent.column = uVar3;
    pSVar1->ref_count = uVar13;
    (pSVar1->padding).bytes = uVar14;
    (pSVar1->padding).extent = TVar4;
  }
  return _Var15;
}

Assistant:

static bool ts_parser__replace_children(TSParser *self, MutableSubtree *tree, SubtreeArray *children) {
  *self->scratch_tree.ptr = *tree->ptr;
  self->scratch_tree.ptr->child_count = 0;
  ts_subtree_set_children(self->scratch_tree, children->contents, children->size, self->language);
  if (ts_parser__select_tree(self, ts_subtree_from_mut(*tree), ts_subtree_from_mut(self->scratch_tree))) {
    *tree->ptr = *self->scratch_tree.ptr;
    return true;
  } else {
    return false;
  }
}